

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int CfdCreateSimpleHandle(void **handle)

{
  void *pvVar1;
  
  if (handle != (void **)0x0) {
    cfd::Initialize();
    pvVar1 = cfd::capi::CfdCapiManager::CreateHandle
                       ((CfdCapiManager *)cfd::capi::capi_instance,true);
    *handle = pvVar1;
  }
  return (uint)(handle == (void **)0x0);
}

Assistant:

int CfdCreateSimpleHandle(void** handle) {
  try {
    if (handle == nullptr) return kCfdIllegalArgumentError;
    cfd::Initialize();
    *handle = cfd::capi::capi_instance.CreateHandle(true);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}